

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O0

size_t Base64decode_len(char *encodedString)

{
  size_t sVar1;
  size_t sourceLength;
  size_t result;
  char *encodedString_local;
  
  sVar1 = strlen(encodedString);
  if (sVar1 == 0) {
    sourceLength = 0;
  }
  else {
    sourceLength = (sVar1 >> 2) * 3;
    if (encodedString[sVar1 - 1] == '=') {
      if (encodedString[sVar1 - 2] == '=') {
        sourceLength = sourceLength - 1;
      }
      sourceLength = sourceLength - 1;
    }
  }
  return sourceLength;
}

Assistant:

static size_t Base64decode_len(const char *encodedString)
{
    size_t result;
    size_t sourceLength = strlen(encodedString);

    if (sourceLength == 0)
    {
        result = 0;
    }
    else
    {
        result = sourceLength / 4 * 3;
        if (encodedString[sourceLength - 1] == '=')
        {
            if (encodedString[sourceLength - 2] == '=')
            {
                result --;
            }
            result--;
        }
    }
    return result;
}